

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O0

MemberSyntax * __thiscall slang::parsing::Parser::parseLibraryMember(Parser *this)

{
  Token semi_00;
  Token include;
  Token semi_01;
  ParserBase *in_RDI;
  Token TVar1;
  Parser *in_stack_00000070;
  Token semi;
  FilePathSpecSyntax *path;
  Token keyword;
  Parser *in_stack_000000d8;
  Token token;
  Parser *in_stack_00000850;
  AttrList in_stack_00000858;
  ParserBase *in_stack_fffffffffffffe98;
  SyntaxFactory *in_stack_fffffffffffffea0;
  nullptr_t in_stack_fffffffffffffea8;
  TokenList *in_stack_fffffffffffffeb0;
  ParserBase *this_00;
  undefined6 in_stack_fffffffffffffec8;
  undefined1 in_stack_ffffffffffffff28 [16];
  unkbyte10 Var2;
  TokenKind local_20;
  ConfigDeclarationSyntax *local_8;
  
  Var2 = in_stack_ffffffffffffff28._6_10_;
  TVar1 = ParserBase::peek(in_stack_fffffffffffffe98);
  local_20 = TVar1.kind;
  if (local_20 == Semicolon) {
    slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
              ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)in_stack_fffffffffffffeb0,
               in_stack_fffffffffffffea8);
    slang::syntax::TokenList::TokenList(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    ParserBase::consume(in_RDI);
    semi_00.info = (Info *)in_stack_fffffffffffffeb0;
    semi_00._0_8_ = in_stack_fffffffffffffea8;
    local_8 = (ConfigDeclarationSyntax *)
              slang::syntax::SyntaxFactory::emptyMember
                        (in_stack_fffffffffffffea0,
                         (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
                         in_stack_fffffffffffffe98,(TokenList *)0x8e7eca,semi_00);
  }
  else if (local_20 == ConfigKeyword) {
    std::span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>::span
              ((span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> *)0x8e7e2d);
    local_8 = parseConfigDeclaration(in_stack_00000850,in_stack_00000858);
  }
  else if (local_20 == IncludeKeyword) {
    ParserBase::consume(in_RDI);
    parseFilePathSpec(in_stack_000000d8);
    TVar1 = ParserBase::expect((ParserBase *)((unkuint10)Var2 >> 0x10),(TokenKind)Var2);
    this_00 = in_RDI + 1;
    slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
              ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)this_00,
               in_stack_fffffffffffffea8);
    include.info = (Info *)this_00;
    include._0_8_ = in_stack_fffffffffffffea8;
    semi_01.info._0_6_ = in_stack_fffffffffffffec8;
    semi_01._0_8_ = in_RDI;
    semi_01.info._6_2_ = local_20;
    local_8 = (ConfigDeclarationSyntax *)
              slang::syntax::SyntaxFactory::libraryIncludeStatement
                        ((SyntaxFactory *)TVar1.info,TVar1._0_8_,include,
                         (FilePathSpecSyntax *)0x8e7fad,semi_01);
  }
  else if (local_20 == LibraryKeyword) {
    local_8 = (ConfigDeclarationSyntax *)parseLibraryDecl(in_stack_00000070);
  }
  else {
    local_8 = (ConfigDeclarationSyntax *)0x0;
  }
  return &local_8->super_MemberSyntax;
}

Assistant:

MemberSyntax* Parser::parseLibraryMember() {
    Token token = peek();
    switch (token.kind) {
        case TokenKind::ConfigKeyword:
            return &parseConfigDeclaration({});
        case TokenKind::Semicolon:
            return &factory.emptyMember(nullptr, nullptr, consume());
        case TokenKind::IncludeKeyword: {
            auto keyword = consume();
            auto& path = parseFilePathSpec();
            auto semi = expect(TokenKind::Semicolon);
            return &factory.libraryIncludeStatement(nullptr, keyword, path, semi);
        }
        case TokenKind::LibraryKeyword:
            return &parseLibraryDecl();
        default:
            return nullptr;
    }
}